

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int Strsafe_insert(char *data)

{
  s_x1node *__s;
  s_x1node *psVar1;
  char **ppcVar2;
  uint uVar3;
  s_x1node **ppsVar4;
  size_t __nmemb;
  s_x1 *psVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  s_x1node *psVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  
  psVar5 = x1a;
  if (x1a == (s_x1 *)0x0) {
LAB_0010c1b4:
    iVar8 = 0;
  }
  else {
    cVar6 = *data;
    if (cVar6 == '\0') {
      uVar12 = 0;
    }
    else {
      pcVar10 = data + 1;
      uVar12 = 0;
      do {
        uVar12 = (int)cVar6 + uVar12 * 0xd;
        cVar6 = *pcVar10;
        pcVar10 = pcVar10 + 1;
      } while (cVar6 != '\0');
    }
    iVar8 = x1a->size;
    for (psVar9 = x1a->ht[iVar8 - 1U & uVar12]; psVar9 != (s_x1node *)0x0; psVar9 = psVar9->next) {
      iVar7 = strcmp(psVar9->data,data);
      if (iVar7 == 0) goto LAB_0010c1b4;
    }
    uVar3 = psVar5->count;
    if (iVar8 <= (int)uVar3) {
      __nmemb = (long)iVar8 * 2;
      psVar9 = (s_x1node *)calloc(__nmemb,0x20);
      if (psVar9 == (s_x1node *)0x0) goto LAB_0010c1b4;
      __s = psVar9 + (long)iVar8 * 2;
      iVar7 = (int)__nmemb;
      if (0 < iVar8) {
        uVar11 = 1;
        if (1 < iVar7) {
          uVar11 = __nmemb & 0xffffffff;
        }
        memset(__s,0,uVar11 << 3);
      }
      if (0 < (int)uVar3) {
        uVar11 = 0;
        do {
          pcVar10 = psVar5->tbl[uVar11].data;
          cVar6 = *pcVar10;
          uVar13 = 0;
          if (cVar6 != '\0') {
            uVar13 = 0;
            pcVar14 = pcVar10;
            do {
              pcVar14 = pcVar14 + 1;
              uVar13 = (int)cVar6 + uVar13 * 0xd;
              cVar6 = *pcVar14;
            } while (cVar6 != '\0');
          }
          uVar13 = uVar13 & iVar7 - 1U;
          psVar1 = psVar9 + uVar11;
          if ((&__s->data)[uVar13] != (char *)0x0) {
            *(s_x1node ***)((&__s->data)[uVar13] + 0x10) = &psVar1->next;
          }
          ppcVar2 = &__s->data + uVar13;
          psVar1->next = (s_x1node *)*ppcVar2;
          psVar1->data = pcVar10;
          psVar1->from = (s_x1node **)ppcVar2;
          *ppcVar2 = (char *)psVar1;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar3);
      }
      free(psVar5->tbl);
      psVar5->size = iVar7;
      psVar5->count = uVar3;
      psVar5->tbl = psVar9;
      psVar5->ht = (s_x1node **)__s;
    }
    uVar12 = psVar5->size - 1U & uVar12;
    iVar8 = psVar5->count;
    psVar5->count = iVar8 + 1;
    psVar9 = psVar5->tbl + iVar8;
    psVar9->data = data;
    ppsVar4 = psVar5->ht;
    if (ppsVar4[uVar12] != (s_x1node *)0x0) {
      ppsVar4[uVar12]->from = &psVar9->next;
    }
    psVar9->next = ppsVar4[uVar12];
    ppsVar4[uVar12] = psVar9;
    psVar9->from = psVar5->ht + uVar12;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Strsafe_insert(const char *data)
{
  x1node *np;
  unsigned h;
  unsigned ph;

  if( x1a==0 ) return 0;
  ph = strhash(data);
  h = ph & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x1a->count>=x1a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x1 array;
    array.size = size = x1a->size*2;
    array.count = x1a->count;
    array.tbl = (x1node*)calloc(size, sizeof(x1node) + sizeof(x1node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x1node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x1a->count; i++){
      x1node *oldnp, *newnp;
      oldnp = &(x1a->tbl[i]);
      h = strhash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x1a->tbl);
    *x1a = array;
  }
  /* Insert the new data */
  h = ph & (x1a->size-1);
  np = &(x1a->tbl[x1a->count++]);
  np->data = data;
  if( x1a->ht[h] ) x1a->ht[h]->from = &(np->next);
  np->next = x1a->ht[h];
  x1a->ht[h] = np;
  np->from = &(x1a->ht[h]);
  return 1;
}